

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameinput.cpp
# Opt level: O0

void __thiscall
gamespace::GameScreenInputState::GameScreenInputState
          (GameScreenInputState *this,GameScreenImpl *impl)

{
  Context *this_00;
  vec2 vVar1;
  float fStack_1c;
  GameScreenImpl *impl_local;
  GameScreenInputState *this_local;
  
  this->_mouse_mode = FREE;
  this_00 = GameScreenImpl::context(impl);
  vVar1 = qe::Context::getResolution(this_00);
  fStack_1c = vVar1.field_0._4_4_;
  this->_resy = (double)fStack_1c;
  this->_impl = impl;
  this->_movementmask[0] = false;
  this->_movementmask[1] = false;
  this->_movementmask[2] = false;
  this->_movementmask[3] = false;
  this->_movementmask[4] = false;
  this->_movementmask[5] = false;
  return;
}

Assistant:

GameScreenInputState::GameScreenInputState(GameScreenImpl &impl): _mouse_mode(FREE), _resy(impl.context()->getResolution().y), _impl(&impl) {
    _movementmask[0] = false;
    _movementmask[1] = false;
    _movementmask[2] = false;
    _movementmask[3] = false;
    _movementmask[4] = false;
    _movementmask[5] = false;
}